

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall llama_model::print_info(llama_model *this)

{
  mapped_type pcVar1;
  ulong uVar2;
  llm_arch lVar3;
  mapped_type *ppcVar4;
  uint32_t uVar5;
  _Alloc_hider _Var6;
  char *pcVar7;
  char *pcVar8;
  double dVar9;
  undefined1 auVar10 [16];
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  ppcVar4 = std::
            map<llama_rope_scaling_type,_const_char_*,_std::less<llama_rope_scaling_type>,_std::allocator<std::pair<const_llama_rope_scaling_type,_const_char_*>_>_>
            ::at(&LLAMA_ROPE_SCALING_TYPES,&(this->hparams).rope_scaling_type_train);
  pcVar1 = *ppcVar4;
  arch_name_abi_cxx11_(&local_68,this);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: arch             = %s\n","print_info",
                     local_68._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_68);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: vocab_only       = %d\n","print_info",
                     (ulong)(this->hparams).vocab_only);
  if ((this->hparams).vocab_only == false) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ctx_train      = %u\n","print_info",
                       (ulong)(this->hparams).n_ctx_train);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd           = %u\n","print_info",
                       (ulong)(this->hparams).n_embd);
    uVar5 = (this->hparams).n_layer;
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_layer          = %u\n","print_info");
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4250:9)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4250:9)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (&local_68,&local_48,
               (function<unsigned_int_(unsigned_int)> *)(ulong)(this->hparams).n_layer,uVar5);
    _Var6._M_p = local_68._M_dataplus._M_p;
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_head           = %s\n","print_info");
    uVar5 = (uint32_t)_Var6._M_p;
    std::__cxx11::string::~string((string *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4251:9)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4251:9)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (&local_68,&local_48,
               (function<unsigned_int_(unsigned_int)> *)(ulong)(this->hparams).n_layer,uVar5);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_head_kv        = %s\n","print_info",
                       local_68._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_rot            = %u\n","print_info",
                       (ulong)(this->hparams).n_rot);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_swa            = %u\n","print_info",
                       (ulong)(this->hparams).n_swa);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_swa_pattern    = %u\n","print_info",
                       (ulong)(this->hparams).n_swa_pattern);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_head_k    = %u\n","print_info",
                       (ulong)(this->hparams).n_embd_head_k);
    uVar5 = (this->hparams).n_embd_head_v;
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_head_v    = %u\n","print_info");
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4257:9)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4257:9)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (&local_68,&local_48,
               (function<unsigned_int_(unsigned_int)> *)(ulong)(this->hparams).n_layer,uVar5);
    _Var6._M_p = local_68._M_dataplus._M_p;
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_gqa            = %s\n","print_info");
    uVar5 = (uint32_t)_Var6._M_p;
    std::__cxx11::string::~string((string *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4258:9)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4258:9)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (&local_68,&local_48,
               (function<unsigned_int_(unsigned_int)> *)(ulong)(this->hparams).n_layer,uVar5);
    _Var6._M_p = local_68._M_dataplus._M_p;
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_k_gqa     = %s\n","print_info");
    uVar5 = (uint32_t)_Var6._M_p;
    std::__cxx11::string::~string((string *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4259:9)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4259:9)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (&local_68,&local_48,
               (function<unsigned_int_(unsigned_int)> *)(ulong)(this->hparams).n_layer,uVar5);
    _Var6._M_p = local_68._M_dataplus._M_p;
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_v_gqa     = %s\n","print_info");
    uVar5 = (uint32_t)_Var6._M_p;
    std::__cxx11::string::~string((string *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: f_norm_eps       = %.1e\n",
                       (double)(this->hparams).f_norm_eps,"print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: f_norm_rms_eps   = %.1e\n",
                       (double)(this->hparams).f_norm_rms_eps,"print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: f_clamp_kqv      = %.1e\n",
                       (double)(this->hparams).f_clamp_kqv,"print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: f_max_alibi_bias = %.1e\n",
                       (double)(this->hparams).f_max_alibi_bias,"print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: f_logit_scale    = %.1e\n",
                       (double)(this->hparams).f_logit_scale,"print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: f_attn_scale     = %.1e\n",
                       (double)(this->hparams).f_attention_scale,"print_info");
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4266:9)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:4266:9)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    const::$_6::operator()::function<unsigned_int(unsigned_int)>_const__unsigned_int__const
              (&local_68,&local_48,
               (function<unsigned_int_(unsigned_int)> *)(ulong)(this->hparams).n_layer,uVar5);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff             = %s\n","print_info",
                       local_68._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_expert         = %u\n","print_info",
                       (ulong)(this->hparams).n_expert);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_expert_used    = %u\n","print_info",
                       (ulong)(this->hparams).n_expert_used);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: causal attn      = %d\n","print_info",
                       (ulong)(this->hparams).causal_attn);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: pooling type     = %d\n","print_info",
                       (ulong)(uint)(this->hparams).pooling_type);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: rope type        = %d\n","print_info",
                       (ulong)(uint)(this->hparams).rope_type);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: rope scaling     = %s\n","print_info",pcVar1);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: freq_base_train  = %.1f\n",
                       (double)(this->hparams).rope_freq_base_train,"print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: freq_scale_train = %g\n",
                       (double)(this->hparams).rope_freq_scale_train,"print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ctx_orig_yarn  = %u\n","print_info",
                       (ulong)(this->hparams).n_ctx_orig_yarn);
    pcVar7 = "unknown";
    if ((this->hparams).rope_finetuned != false) {
      pcVar7 = "yes";
    }
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: rope_finetuned   = %s\n","print_info",pcVar7);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: ssm_d_conv       = %u\n","print_info",
                       (ulong)(this->hparams).ssm_d_conv);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: ssm_d_inner      = %u\n","print_info",
                       (ulong)(this->hparams).ssm_d_inner);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: ssm_d_state      = %u\n","print_info",
                       (ulong)(this->hparams).ssm_d_state);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: ssm_dt_rank      = %u\n","print_info",
                       (ulong)(this->hparams).ssm_dt_rank);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: ssm_dt_b_c_rms   = %d\n","print_info",
                       (ulong)(this->hparams).ssm_dt_b_c_rms);
  }
  type_name_abi_cxx11_(&local_68,this);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: model type       = %s\n","print_info",
                     local_68._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_68);
  uVar2 = ((this->pimpl)._M_t.
           super___uniq_ptr_impl<llama_model::impl,_std::default_delete<llama_model::impl>_>._M_t.
           super__Tuple_impl<0UL,_llama_model::impl_*,_std::default_delete<llama_model::impl>_>.
           super__Head_base<0UL,_llama_model::impl_*,_false>._M_head_impl)->n_elements;
  if (uVar2 >> 0xc < 0xe8d4a51) {
    if (uVar2 < 1000000000) {
      if (uVar2 < 1000000) {
        dVar9 = (double)(long)uVar2 * 0.001;
        pcVar7 = "%s: model params     = %.2f K\n";
      }
      else {
        dVar9 = (double)(long)uVar2 * 1e-06;
        pcVar7 = "%s: model params     = %.2f M\n";
      }
    }
    else {
      dVar9 = (double)(long)uVar2 * 1e-09;
      pcVar7 = "%s: model params     = %.2f B\n";
    }
  }
  else {
    auVar10._8_4_ = (int)(uVar2 >> 0x20);
    auVar10._0_8_ = uVar2;
    auVar10._12_4_ = 0x45300000;
    dVar9 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1e-12;
    pcVar7 = "%s: model params     = %.2f T\n";
  }
  llama_log_internal(GGML_LOG_LEVEL_INFO,pcVar7,dVar9,"print_info");
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: general.name     = %s\n","print_info",
                     (this->name)._M_dataplus._M_p);
  lVar3 = this->arch;
  if (lVar3 == LLM_ARCH_DEEPSEEK) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_layer_dense_lead   = %d\n","print_info",
                       (ulong)(this->hparams).n_layer_dense_lead);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_exp             = %d\n","print_info",
                       (ulong)(this->hparams).n_ff_exp);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_expert_shared      = %d\n","print_info",
                       (ulong)(this->hparams).n_expert_shared);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: expert_weights_scale = %.1f\n",
                       (double)(this->hparams).expert_weights_scale,"print_info");
    lVar3 = this->arch;
  }
  if (lVar3 == LLM_ARCH_DEEPSEEK2) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_layer_dense_lead   = %d\n","print_info",
                       (ulong)(this->hparams).n_layer_dense_lead);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_lora_q             = %d\n","print_info",
                       (ulong)(this->hparams).n_lora_q);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_lora_kv            = %d\n","print_info",
                       (ulong)(this->hparams).n_lora_kv);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_head_k_mla    = %d\n","print_info",
                       (ulong)(this->hparams).n_embd_head_k_mla);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_embd_head_v_mla    = %d\n","print_info",
                       (ulong)(this->hparams).n_embd_head_v_mla);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_exp             = %d\n","print_info",
                       (ulong)(this->hparams).n_ff_exp);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_expert_shared      = %d\n","print_info",
                       (ulong)(this->hparams).n_expert_shared);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: expert_weights_scale = %.1f\n",
                       (double)(this->hparams).expert_weights_scale,"print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: expert_weights_norm  = %d\n","print_info",
                       (ulong)(this->hparams).expert_weights_norm);
    uVar5 = (this->hparams).expert_gating_func;
    pcVar7 = "unknown";
    if (uVar5 == 2) {
      pcVar7 = "sigmoid";
    }
    pcVar8 = "softmax";
    if (uVar5 != 1) {
      pcVar8 = pcVar7;
    }
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: expert_gating_func   = %s\n","print_info",pcVar8);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: rope_yarn_log_mul    = %.4f\n",
                       (double)(this->hparams).rope_yarn_log_mul,"print_info");
    lVar3 = this->arch;
  }
  if (lVar3 == LLM_ARCH_QWEN2MOE) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_exp         = %d\n","print_info",
                       (ulong)(this->hparams).n_ff_exp);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_shexp       = %d\n","print_info",
                       (ulong)(this->hparams).n_ff_shexp);
    lVar3 = this->arch;
  }
  if (lVar3 == LLM_ARCH_QWEN3MOE) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_exp         = %d\n","print_info",
                       (ulong)(this->hparams).n_ff_exp);
    lVar3 = this->arch;
  }
  if ((lVar3 < LLM_ARCH_CHAMELEON) && ((0x3000000040000000U >> ((ulong)lVar3 & 0x3f) & 1) != 0)) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: f_embedding_scale = %f\n",
                       (double)(this->hparams).f_embedding_scale,"print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: f_residual_scale  = %f\n",
                       (double)(this->hparams).f_residual_scale,"print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: f_attention_scale = %f\n",
                       (double)(this->hparams).f_attention_scale,"print_info");
    lVar3 = this->arch;
  }
  if (lVar3 == LLM_ARCH_BAILINGMOE) {
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_layer_dense_lead   = %d\n","print_info",
                       (ulong)(this->hparams).n_layer_dense_lead);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ff_exp             = %d\n","print_info",
                       (ulong)(this->hparams).n_ff_exp);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_expert_shared      = %d\n","print_info",
                       (ulong)(this->hparams).n_expert_shared);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: expert_weights_scale = %.1f\n",
                       (double)(this->hparams).expert_weights_scale,"print_info");
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: expert_weights_norm  = %d\n","print_info",
                       (ulong)(this->hparams).expert_weights_norm);
  }
  llama_vocab::print_info(&this->vocab);
  return;
}

Assistant:

void llama_model::print_info() const {
    const char * rope_scaling_type = LLAMA_ROPE_SCALING_TYPES.at(hparams.rope_scaling_type_train);

    auto print_f = [](const std::function<uint32_t(uint32_t)> & f, uint32_t n) {
        bool is_var = false;

        std::vector<uint32_t> v;
        for (uint32_t i = 0; i < n; ++i) {
            v.push_back(f(i));
            if (v[i] != v[0]) {
                is_var = true;
            }
        }

        std::stringstream ss;

        if (is_var) {
            ss << "[";
            for (uint32_t i = 0; i < n; ++i) {
                ss << v[i];
                if (i < n - 1) {
                    ss << ", ";
                }
            }
            ss << "]";
        } else {
            ss << v[0];
        }

        return ss.str();
    };

    // hparams
    LLAMA_LOG_INFO("%s: arch             = %s\n",     __func__, arch_name().c_str());
    LLAMA_LOG_INFO("%s: vocab_only       = %d\n",     __func__, hparams.vocab_only);

    if (!hparams.vocab_only) {
        LLAMA_LOG_INFO("%s: n_ctx_train      = %u\n",     __func__, hparams.n_ctx_train);
        LLAMA_LOG_INFO("%s: n_embd           = %u\n",     __func__, hparams.n_embd);
        LLAMA_LOG_INFO("%s: n_layer          = %u\n",     __func__, hparams.n_layer);
        LLAMA_LOG_INFO("%s: n_head           = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_head(il);    }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: n_head_kv        = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_head_kv(il); }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: n_rot            = %u\n",     __func__, hparams.n_rot);
        LLAMA_LOG_INFO("%s: n_swa            = %u\n",     __func__, hparams.n_swa);
        LLAMA_LOG_INFO("%s: n_swa_pattern    = %u\n",     __func__, hparams.n_swa_pattern);
        LLAMA_LOG_INFO("%s: n_embd_head_k    = %u\n",     __func__, hparams.n_embd_head_k);
        LLAMA_LOG_INFO("%s: n_embd_head_v    = %u\n",     __func__, hparams.n_embd_head_v);
        LLAMA_LOG_INFO("%s: n_gqa            = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_gqa(il);        }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: n_embd_k_gqa     = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_embd_k_gqa(il); }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: n_embd_v_gqa     = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_embd_v_gqa(il); }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: f_norm_eps       = %.1e\n",   __func__, hparams.f_norm_eps);
        LLAMA_LOG_INFO("%s: f_norm_rms_eps   = %.1e\n",   __func__, hparams.f_norm_rms_eps);
        LLAMA_LOG_INFO("%s: f_clamp_kqv      = %.1e\n",   __func__, hparams.f_clamp_kqv);
        LLAMA_LOG_INFO("%s: f_max_alibi_bias = %.1e\n",   __func__, hparams.f_max_alibi_bias);
        LLAMA_LOG_INFO("%s: f_logit_scale    = %.1e\n",   __func__, hparams.f_logit_scale);
        LLAMA_LOG_INFO("%s: f_attn_scale     = %.1e\n",   __func__, hparams.f_attention_scale);
        LLAMA_LOG_INFO("%s: n_ff             = %s\n",     __func__, print_f([&](uint32_t il) { return hparams.n_ff(il); }, hparams.n_layer).c_str());
        LLAMA_LOG_INFO("%s: n_expert         = %u\n",     __func__, hparams.n_expert);
        LLAMA_LOG_INFO("%s: n_expert_used    = %u\n",     __func__, hparams.n_expert_used);
        LLAMA_LOG_INFO("%s: causal attn      = %d\n",     __func__, hparams.causal_attn);
        LLAMA_LOG_INFO("%s: pooling type     = %d\n",     __func__, hparams.pooling_type);
        LLAMA_LOG_INFO("%s: rope type        = %d\n",     __func__, hparams.rope_type);
        LLAMA_LOG_INFO("%s: rope scaling     = %s\n",     __func__, rope_scaling_type);
        LLAMA_LOG_INFO("%s: freq_base_train  = %.1f\n",   __func__, hparams.rope_freq_base_train);
        LLAMA_LOG_INFO("%s: freq_scale_train = %g\n",     __func__, hparams.rope_freq_scale_train);
        LLAMA_LOG_INFO("%s: n_ctx_orig_yarn  = %u\n",     __func__, hparams.n_ctx_orig_yarn);
        LLAMA_LOG_INFO("%s: rope_finetuned   = %s\n",     __func__, hparams.rope_finetuned ? "yes" : "unknown");
        LLAMA_LOG_INFO("%s: ssm_d_conv       = %u\n",     __func__, hparams.ssm_d_conv);
        LLAMA_LOG_INFO("%s: ssm_d_inner      = %u\n",     __func__, hparams.ssm_d_inner);
        LLAMA_LOG_INFO("%s: ssm_d_state      = %u\n",     __func__, hparams.ssm_d_state);
        LLAMA_LOG_INFO("%s: ssm_dt_rank      = %u\n",     __func__, hparams.ssm_dt_rank);
        LLAMA_LOG_INFO("%s: ssm_dt_b_c_rms   = %d\n",     __func__, hparams.ssm_dt_b_c_rms);
    }

    LLAMA_LOG_INFO("%s: model type       = %s\n",     __func__, type_name().c_str());
    if (pimpl->n_elements >= 1e12) {
        LLAMA_LOG_INFO("%s: model params     = %.2f T\n", __func__, pimpl->n_elements*1e-12);
    } else if (pimpl->n_elements >= 1e9) {
        LLAMA_LOG_INFO("%s: model params     = %.2f B\n", __func__, pimpl->n_elements*1e-9);
    } else if (pimpl->n_elements >= 1e6) {
        LLAMA_LOG_INFO("%s: model params     = %.2f M\n", __func__, pimpl->n_elements*1e-6);
    } else {
        LLAMA_LOG_INFO("%s: model params     = %.2f K\n", __func__, pimpl->n_elements*1e-3);
    }

    // general kv
    LLAMA_LOG_INFO("%s: general.name     = %s\n",    __func__, name.c_str());

    if (arch == LLM_ARCH_DEEPSEEK) {
        LLAMA_LOG_INFO("%s: n_layer_dense_lead   = %d\n",     __func__, hparams.n_layer_dense_lead);
        LLAMA_LOG_INFO("%s: n_ff_exp             = %d\n",     __func__, hparams.n_ff_exp);
        LLAMA_LOG_INFO("%s: n_expert_shared      = %d\n",     __func__, hparams.n_expert_shared);
        LLAMA_LOG_INFO("%s: expert_weights_scale = %.1f\n",   __func__, hparams.expert_weights_scale);
    }

    if (arch == LLM_ARCH_DEEPSEEK2) {
        LLAMA_LOG_INFO("%s: n_layer_dense_lead   = %d\n",     __func__, hparams.n_layer_dense_lead);
        LLAMA_LOG_INFO("%s: n_lora_q             = %d\n",     __func__, hparams.n_lora_q);
        LLAMA_LOG_INFO("%s: n_lora_kv            = %d\n",     __func__, hparams.n_lora_kv);
        LLAMA_LOG_INFO("%s: n_embd_head_k_mla    = %d\n",     __func__, hparams.n_embd_head_k_mla);
        LLAMA_LOG_INFO("%s: n_embd_head_v_mla    = %d\n",     __func__, hparams.n_embd_head_v_mla);
        LLAMA_LOG_INFO("%s: n_ff_exp             = %d\n",     __func__, hparams.n_ff_exp);
        LLAMA_LOG_INFO("%s: n_expert_shared      = %d\n",     __func__, hparams.n_expert_shared);
        LLAMA_LOG_INFO("%s: expert_weights_scale = %.1f\n",   __func__, hparams.expert_weights_scale);
        LLAMA_LOG_INFO("%s: expert_weights_norm  = %d\n",     __func__, hparams.expert_weights_norm);
        LLAMA_LOG_INFO("%s: expert_gating_func   = %s\n",     __func__, llama_expert_gating_func_name((llama_expert_gating_func_type) hparams.expert_gating_func));
        LLAMA_LOG_INFO("%s: rope_yarn_log_mul    = %.4f\n",   __func__, hparams.rope_yarn_log_mul);
    }

    if (arch == LLM_ARCH_QWEN2MOE) {
        LLAMA_LOG_INFO("%s: n_ff_exp         = %d\n",     __func__, hparams.n_ff_exp);
        LLAMA_LOG_INFO("%s: n_ff_shexp       = %d\n",     __func__, hparams.n_ff_shexp);
    }

    if (arch == LLM_ARCH_QWEN3MOE) {
        LLAMA_LOG_INFO("%s: n_ff_exp         = %d\n",     __func__, hparams.n_ff_exp);
    }

    if (arch == LLM_ARCH_MINICPM || arch == LLM_ARCH_GRANITE || arch == LLM_ARCH_GRANITE_MOE) {
        LLAMA_LOG_INFO("%s: f_embedding_scale = %f\n", __func__, hparams.f_embedding_scale);
        LLAMA_LOG_INFO("%s: f_residual_scale  = %f\n", __func__, hparams.f_residual_scale);
        LLAMA_LOG_INFO("%s: f_attention_scale = %f\n", __func__, hparams.f_attention_scale);
    }

    if (arch == LLM_ARCH_BAILINGMOE) {
        LLAMA_LOG_INFO("%s: n_layer_dense_lead   = %d\n",     __func__, hparams.n_layer_dense_lead);
        LLAMA_LOG_INFO("%s: n_ff_exp             = %d\n",     __func__, hparams.n_ff_exp);
        LLAMA_LOG_INFO("%s: n_expert_shared      = %d\n",     __func__, hparams.n_expert_shared);
        LLAMA_LOG_INFO("%s: expert_weights_scale = %.1f\n",   __func__, hparams.expert_weights_scale);
        LLAMA_LOG_INFO("%s: expert_weights_norm  = %d\n",     __func__, hparams.expert_weights_norm);
    }

    vocab.print_info();
}